

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DisableStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DisableStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::NameSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          NameSyntax *args_3,Token *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  DisableStatementSyntax *this_00;
  
  this_00 = (DisableStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DisableStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (DisableStatementSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar3 = args_2->kind;
  uVar4 = args_2->field_0x2;
  NVar5.raw = (args_2->numFlags).raw;
  uVar6 = args_2->rawLen;
  pIVar1 = args_2->info;
  TVar7 = args_4->kind;
  uVar8 = args_4->field_0x2;
  NVar9.raw = (args_4->numFlags).raw;
  uVar10 = args_4->rawLen;
  pIVar2 = args_4->info;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,DisableStatement,*args,args_1);
  (this_00->disable).kind = TVar3;
  (this_00->disable).field_0x2 = uVar4;
  (this_00->disable).numFlags = (NumericTokenFlags)NVar5.raw;
  (this_00->disable).rawLen = uVar6;
  (this_00->disable).info = pIVar1;
  (this_00->name).ptr = args_3;
  (this_00->semi).kind = TVar7;
  (this_00->semi).field_0x2 = uVar8;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar9.raw;
  (this_00->semi).rawLen = uVar10;
  (this_00->semi).info = pIVar2;
  (args_3->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }